

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::datastring<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  undefined1 local_58 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  
  while (Lexer::takeString_abi_cxx11_
                   ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_58,&ctx->in),
        str.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ == '\x01') {
    str.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = 0;
    if (local_58 !=
        (undefined1  [8])
        ((long)&str.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload + 8)) {
      operator_delete((void *)local_58,
                      str.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_string_length + 1);
    }
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::DataStringT> datastring(Ctx& ctx) {
  auto data = ctx.makeDataString();
  while (auto str = ctx.in.takeString()) {
    ctx.appendDataString(data, *str);
  }
  return data;
}